

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

completion *
mjs::accept<mjs::interpreter::impl>(completion *__return_storage_ptr__,statement *s,impl *v)

{
  int iVar1;
  _func_int **pp_Var2;
  completion_type t;
  wstring_view target;
  element_type *peVar3;
  
  iVar1 = (*(s->super_syntax_node)._vptr_syntax_node[3])(s);
  switch(iVar1) {
  case 0:
    interpreter::impl::operator()(__return_storage_ptr__,v,(block_statement *)s);
    break;
  case 1:
    interpreter::impl::operator()(__return_storage_ptr__,v,(variable_statement *)s);
    break;
  case 2:
  case 3:
    completion::completion(__return_storage_ptr__,(value *)&value::undefined,normal);
    break;
  case 4:
    interpreter::impl::operator()(__return_storage_ptr__,v,(expression_statement *)s);
    break;
  case 5:
    interpreter::impl::operator()(__return_storage_ptr__,v,(if_statement *)s);
    break;
  case 6:
    interpreter::impl::operator()(__return_storage_ptr__,v,(do_statement *)s);
    break;
  case 7:
    interpreter::impl::operator()(__return_storage_ptr__,v,(while_statement *)s);
    break;
  case 8:
    interpreter::impl::operator()(__return_storage_ptr__,v,(for_statement *)s);
    break;
  case 9:
    interpreter::impl::operator()(__return_storage_ptr__,v,(for_in_statement *)s);
    break;
  case 10:
    pp_Var2 = s[1].super_syntax_node._vptr_syntax_node;
    peVar3 = s[1].super_syntax_node.extend_.file.
             super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    t = continue_;
    goto LAB_0011e82b;
  case 0xb:
    pp_Var2 = s[1].super_syntax_node._vptr_syntax_node;
    peVar3 = s[1].super_syntax_node.extend_.file.
             super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    t = break_;
LAB_0011e82b:
    target._M_str = (wchar_t *)pp_Var2;
    target._M_len = (size_t)peVar3;
    completion::completion(__return_storage_ptr__,t,target);
    break;
  case 0xc:
    interpreter::impl::operator()(__return_storage_ptr__,v,(return_statement *)s);
    break;
  case 0xd:
    interpreter::impl::operator()(__return_storage_ptr__,v,(with_statement *)s);
    break;
  case 0xe:
    interpreter::impl::operator()(__return_storage_ptr__,v,(labelled_statement *)s);
    break;
  case 0xf:
    interpreter::impl::operator()(__return_storage_ptr__,v,(switch_statement *)s);
    break;
  case 0x10:
    interpreter::impl::operator()(__return_storage_ptr__,v,(throw_statement *)s);
    break;
  case 0x11:
    interpreter::impl::operator()(__return_storage_ptr__,v,(try_statement *)s);
    break;
  case 0x12:
    interpreter::impl::operator()(__return_storage_ptr__,v,(function_definition *)s);
    break;
  default:
    __assert_fail("!\"Not implemented\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x3d6,
                  "auto mjs::accept(const statement &, Visitor &) [Visitor = mjs::interpreter::impl]"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

auto accept(const statement& s, Visitor& v) {
    switch (s.type()) {
    case statement_type::block:                 return v(static_cast<const block_statement&>(s));
    case statement_type::variable:              return v(static_cast<const variable_statement&>(s));
    case statement_type::debugger:              return v(static_cast<const debugger_statement&>(s));
    case statement_type::empty:                 return v(static_cast<const empty_statement&>(s));
    case statement_type::expression:            return v(static_cast<const expression_statement&>(s));
    case statement_type::if_:                   return v(static_cast<const if_statement&>(s));
    case statement_type::do_:                   return v(static_cast<const do_statement&>(s));
    case statement_type::while_:                return v(static_cast<const while_statement&>(s));
    case statement_type::for_:                  return v(static_cast<const for_statement&>(s));
    case statement_type::for_in:                return v(static_cast<const for_in_statement&>(s));
    case statement_type::continue_:             return v(static_cast<const continue_statement&>(s));
    case statement_type::break_:                return v(static_cast<const break_statement&>(s));
    case statement_type::return_:               return v(static_cast<const return_statement&>(s));
    case statement_type::with:                  return v(static_cast<const with_statement&>(s));
    case statement_type::labelled:              return v(static_cast<const labelled_statement&>(s));
    case statement_type::switch_:               return v(static_cast<const switch_statement&>(s));
    case statement_type::throw_:                return v(static_cast<const throw_statement&>(s));
    case statement_type::try_:                  return v(static_cast<const try_statement&>(s));
    case statement_type::function_definition:   return v(static_cast<const function_definition&>(s));
    }
    assert(!"Not implemented");
    return v(s);
}